

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O2

void __thiscall
QEventDispatcherUNIXPrivate::markPendingSocketNotifiers(QEventDispatcherUNIXPrivate *this)

{
  pollfd *ppVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  QSocketNotifier *this_00;
  ushort uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  pollfd *pfd;
  pollfd *key;
  long in_FS_OFFSET;
  iterator iVar9;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  key = (this->pollfds).d.ptr;
  ppVar1 = key + (this->pollfds).d.size;
  for (; key != ppVar1; key = key + 1) {
    if ((-1 < key->fd) && (key->revents != 0)) {
      iVar9 = QHash<int,_QSocketNotifierSetUNIX>::findImpl<int>(&this->socketNotifiers,&key->fd);
      pSVar3 = (iVar9.i.d)->spans;
      uVar6 = iVar9.i.bucket >> 7;
      uVar7 = (uint)iVar9.i.bucket & 0x7f;
      pEVar4 = pSVar3[uVar6].entries;
      bVar2 = pSVar3[uVar6].offsets[uVar7];
      for (lVar8 = 4; lVar8 != 0x1c; lVar8 = lVar8 + 8) {
        this_00 = *(QSocketNotifier **)
                   (pEVar4[bVar2].storage.data +
                   (ulong)*(uint *)(
                                   "_Tp &std::_Optional_base_impl<std::chrono::duration<long, std::ratio<1, 1000000000>>, std::_Optional_base<std::chrono::duration<long, std::ratio<1, 1000000000>>>>::_M_get() [_Tp = std::chrono::duration<long, std::ratio<1, 1000000000>>, _Dp = std::_Optional_base<std::chrono::duration<long, std::ratio<1, 1000000000>>>]"
                                   + lVar8 + 0x13d) * 8 + 8);
        if (this_00 != (QSocketNotifier *)0x0) {
          uVar5 = key->revents;
          if ((uVar5 & 0x20) != 0) {
            local_58.context.version = 2;
            local_58.context._4_8_ = 0;
            local_58.context._12_8_ = 0;
            local_58.context.function._4_4_ = 0;
            local_58.context.category = "default";
            pSVar3 = (iVar9.i.d)->spans;
            QMessageLogger::warning
                      (&local_58,"QSocketNotifier: Invalid socket %d with type %s, disabling...",
                       (ulong)*(uint *)pSVar3[uVar6].entries[pSVar3[uVar6].offsets[uVar7]].storage.
                                       data,
                       (&PTR_anon_var_dwarf_ffa5b8_00668d00)
                       [(int)*(uint *)(
                                      "_Tp &std::_Optional_base_impl<std::chrono::duration<long, std::ratio<1, 1000000000>>, std::_Optional_base<std::chrono::duration<long, std::ratio<1, 1000000000>>>>::_M_get() [_Tp = std::chrono::duration<long, std::ratio<1, 1000000000>>, _Dp = std::_Optional_base<std::chrono::duration<long, std::ratio<1, 1000000000>>>]"
                                      + lVar8 + 0x13d)]);
            QSocketNotifier::setEnabled(this_00,false);
            uVar5 = key->revents;
          }
          if ((*(ushort *)((long)&markPendingSocketNotifiers::notifiers[0].type + lVar8) & uVar5) !=
              0) {
            setSocketNotifierPending(this,this_00);
          }
        }
      }
    }
  }
  QList<pollfd>::clear(&this->pollfds);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEventDispatcherUNIXPrivate::markPendingSocketNotifiers()
{
    for (const pollfd &pfd : std::as_const(pollfds)) {
        if (pfd.fd < 0 || pfd.revents == 0)
            continue;

        auto it = socketNotifiers.find(pfd.fd);
        Q_ASSERT(it != socketNotifiers.end());

        const QSocketNotifierSetUNIX &sn_set = it.value();

        static const struct {
            QSocketNotifier::Type type;
            short flags;
        } notifiers[] = {
            { QSocketNotifier::Read,      POLLIN  | POLLHUP | POLLERR },
            { QSocketNotifier::Write,     POLLOUT | POLLHUP | POLLERR },
            { QSocketNotifier::Exception, POLLPRI | POLLHUP | POLLERR }
        };

        for (const auto &n : notifiers) {
            QSocketNotifier *notifier = sn_set.notifiers[n.type];

            if (!notifier)
                continue;

            if (pfd.revents & POLLNVAL) {
                qWarning("QSocketNotifier: Invalid socket %d with type %s, disabling...",
                         it.key(), socketType(n.type));
                notifier->setEnabled(false);
            }

            if (pfd.revents & n.flags)
                setSocketNotifierPending(notifier);
        }
    }

    pollfds.clear();
}